

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O0

void __thiscall adios2::transport::FilePOSIX::FilePOSIX(FilePOSIX *this,Comm *comm)

{
  undefined8 *in_RDI;
  allocator local_69;
  Comm *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  Transport *in_stack_ffffffffffffffb0;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"File",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff98,"POSIX",&local_69);
  Transport::Transport
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  *in_RDI = &PTR__FilePOSIX_01135ca0;
  *(undefined4 *)(in_RDI + 0x1e) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0xf4) = 0;
  *(undefined1 *)(in_RDI + 0x1f) = 0;
  *(undefined1 *)((long)in_RDI + 0xf9) = 0;
  std::future<int>::future((future<int> *)0xd76fc1);
  *(undefined1 *)(in_RDI + 0x22) = 0;
  return;
}

Assistant:

FilePOSIX::FilePOSIX(helper::Comm const &comm) : Transport("File", "POSIX", comm) {}